

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  int iVar2;
  sqlite3 *db;
  Mem *p_00;
  sqlite3_value *psVar3;
  
  db = p->db;
  iVar2 = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    db->errCode = iVar2;
    p_00 = db->pErr;
    if (p_00 != (Mem *)0x0) {
      if ((p_00->flags & 0x2460) == 0) {
        p_00->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p_00);
      }
    }
  }
  else {
    uVar1 = db->mallocFailed;
    if (sqlite3Hooks_0 != (code *)0x0) {
      (*sqlite3Hooks_0)();
    }
    if (db->pErr == (sqlite3_value *)0x0) {
      psVar3 = (sqlite3_value *)sqlite3DbMallocRaw(db,0x38);
      if (psVar3 != (sqlite3_value *)0x0) {
        (psVar3->u).r = 0.0;
        psVar3->flags = 0;
        psVar3->enc = '\0';
        psVar3->field_0xb = 0;
        psVar3->n = 0;
        psVar3->szMalloc = 0;
        psVar3->uTemp = 0;
        psVar3->db = (sqlite3 *)0x0;
        psVar3->z = (char *)0x0;
        psVar3->zMalloc = (char *)0x0;
        psVar3->xDel = (_func_void_void_ptr *)0x0;
        psVar3->flags = 1;
        psVar3->db = db;
      }
      db->pErr = psVar3;
    }
    if (db->pErr != (Mem *)0x0) {
      sqlite3VdbeMemSetStr(db->pErr,p->zErrMsg,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    }
    if (sqlite3Hooks_1 != (code *)0x0) {
      (*sqlite3Hooks_1)();
    }
    db->mallocFailed = uVar1;
    db->errCode = iVar2;
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    if( db->pErr==0 ) db->pErr = sqlite3ValueNew(db);
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc);
  }
  return rc;
}